

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

void __thiscall absl::base_internal::anon_unknown_0::ArenaLock::Leave(ArenaLock *this)

{
  uint uVar1;
  undefined8 in_R9;
  char *absl_raw_logging_internal_basename;
  int err;
  ArenaLock *this_local;
  
  SpinLock::Unlock(&this->arena_->mu);
  if (((this->mask_valid_ & 1U) != 0) &&
     (uVar1 = pthread_sigmask(2,(__sigset_t *)&this->mask_,(__sigset_t *)0x0), uVar1 != 0)) {
    raw_logging_internal::RawLog
              (kFatal,"low_level_alloc.cc",0x12d,"pthread_sigmask failed: %d",(ulong)uVar1,in_R9,
               this,"low_level_alloc.cc");
  }
  this->left_ = true;
  return;
}

Assistant:

void Leave() ABSL_UNLOCK_FUNCTION() {
    arena_->mu.Unlock();
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
    if (mask_valid_) {
      const int err = pthread_sigmask(SIG_SETMASK, &mask_, nullptr);
      if (err != 0) {
        ABSL_RAW_LOG(FATAL, "pthread_sigmask failed: %d", err);
      }
    }
#endif
    left_ = true;
  }